

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall fasttext::FastText::saveModel(FastText *this)

{
  byte bVar1;
  ostream *this_00;
  ostream *in_RDI;
  ofstream ofs;
  ostream *in_stack_fffffffffffffda8;
  undefined7 in_stack_fffffffffffffdb0;
  Args *this_01;
  char *in_stack_fffffffffffffdd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd8;
  undefined1 local_208 [192];
  ostream *in_stack_fffffffffffffeb8;
  Dictionary *in_stack_fffffffffffffec0;
  
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x138871);
  this_01 = (Args *)&stack0xfffffffffffffdd8;
  std::operator+(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
  std::ofstream::ofstream(local_208,(string *)this_01,_S_bin);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffdd8);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) == 0) {
    this_00 = std::operator<<((ostream *)&std::cerr,"Model file cannot be opened for saving!");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x138941);
  Args::save(this_01,in_RDI);
  std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x13895e);
  Dictionary::save(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x13897b);
  Matrix::save((Matrix *)CONCAT17(bVar1,in_stack_fffffffffffffdb0),in_stack_fffffffffffffda8);
  std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x138998);
  Matrix::save((Matrix *)CONCAT17(bVar1,in_stack_fffffffffffffdb0),in_stack_fffffffffffffda8);
  std::ofstream::close();
  std::ofstream::~ofstream(local_208);
  return;
}

Assistant:

void FastText::saveModel() {
  std::ofstream ofs(args_->output + ".bin", std::ofstream::binary);
  if (!ofs.is_open()) {
    std::cerr << "Model file cannot be opened for saving!" << std::endl;
    exit(EXIT_FAILURE);
  }
  args_->save(ofs);
  dict_->save(ofs);
  input_->save(ofs);
  output_->save(ofs);
  ofs.close();
}